

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O2

string * spdlog::details::os::filename_to_str(string *__return_storage_ptr__,filename_t *filename)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE std::string filename_to_str(const filename_t &filename)
{
    return filename;
}